

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.h
# Opt level: O0

void BuilderTests<flatbuffers::FlatBufferBuilderImpl<false>,_flatbuffers::FlatBufferBuilderImpl<false>_>
     ::all_tests(void)

{
  size_t buffer_minalign;
  FlatBufferBuilderImpl<false> local_88;
  
  empty_builder_movector_test();
  nonempty_builder_movector_test();
  builder_movector_before_finish_test();
  builder_movector_after_finish_test();
  builder_move_assign_before_finish_test();
  builder_move_assign_after_finish_test();
  builder_move_assign_after_release_test();
  buffer_minalign = flatbuffers::AlignOf<unsigned_long>();
  flatbuffers::FlatBufferBuilderImpl<false>::FlatBufferBuilderImpl
            (&local_88,0x400,(Allocator *)0x0,false,buffer_minalign);
  builder_move_assign_after_releaseraw_test<flatbuffers::FlatBufferBuilderImpl<false>>(&local_88);
  flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&local_88);
  builder_swap_before_finish_test(true);
  builder_swap_after_finish_test(true);
  return;
}

Assistant:

static void all_tests() {
    empty_builder_movector_test();
    nonempty_builder_movector_test();
    builder_movector_before_finish_test();
    builder_movector_after_finish_test();
    builder_move_assign_before_finish_test();
    builder_move_assign_after_finish_test();
    builder_move_assign_after_release_test();
    builder_move_assign_after_releaseraw_test(DestBuilder());
    builder_swap_before_finish_test();
    builder_swap_after_finish_test();
  }